

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase881::run(TestCase881 *this)

{
  Builder builder_00;
  Reader reader;
  size_t sVar1;
  int local_20c;
  DebugComparison<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>_&,_std::nullptr_t>
  _kjCondition;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  uint local_1ac;
  DebugComparison<int,_unsigned_int> _kjCondition_4;
  Builder root;
  StructBuilder local_160;
  StructReader local_138;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&orphan,&builder.super_MessageBuilder);
  _kjCondition.op.content.ptr = (char *)orphan.builder.capTable;
  _kjCondition.left =
       (Orphan<capnproto_test::capnp::test::TestAllTypes> *)orphan.builder.tag.content;
  _kjCondition.right = orphan.builder.segment;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&_kjCondition,(StructSize)0x140006);
  _kjCondition_4.op.content.size_ = (size_t)(root._builder.pointers + 2);
  _kjCondition_4._0_8_ = root._builder.segment;
  _kjCondition_4.op.content.ptr = (char *)root._builder.capTable;
  PointerBuilder::disown((OrphanBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_4);
  sVar1 = _kjCondition.op.content.size_;
  orphan.builder.capTable = (CapTableBuilder *)_kjCondition.op.content.ptr;
  orphan.builder.location = (word *)_kjCondition.op.content.size_;
  orphan.builder.tag.content = (uint64_t)_kjCondition.left;
  orphan.builder.segment = (SegmentBuilder *)_kjCondition.right;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = sVar1 == 0;
  _kjCondition.left = &orphan;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x377,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",&_kjCondition);
  }
  OrphanBuilder::asStructReader(&local_138,&orphan.builder,(StructSize)0x140006);
  reader._reader.capTable = local_138.capTable;
  reader._reader.segment = local_138.segment;
  reader._reader.data = local_138.data;
  reader._reader.pointers = local_138.pointers;
  reader._reader.dataSize = local_138.dataSize;
  reader._reader.pointerCount = local_138.pointerCount;
  reader._reader._38_2_ = local_138._38_2_;
  reader._reader.nestingLimit = local_138.nestingLimit;
  reader._reader._44_4_ = local_138._44_4_;
  checkTestMessageAllZero(reader);
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x37a,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",&_kjCondition);
  }
  OrphanBuilder::asStruct(&local_160,&orphan.builder,(StructSize)0x140006);
  builder_00._builder.capTable = local_160.capTable;
  builder_00._builder.segment = local_160.segment;
  builder_00._builder.data = local_160.data;
  builder_00._builder.pointers = local_160.pointers;
  builder_00._builder.dataSize = local_160.dataSize;
  builder_00._builder.pointerCount = local_160.pointerCount;
  builder_00._builder._38_2_ = local_160._38_2_;
  checkTestMessageAllZero(builder_00);
  _kjCondition.left =
       (Orphan<capnproto_test::capnp::test::TestAllTypes> *)
       CONCAT71(_kjCondition.left._1_7_,orphan.builder.location != (word *)0x0);
  if ((orphan.builder.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x37e,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\", _kjCondition",
               (char (*) [38])"failed: expected !(orphan == nullptr)",
               (DebugExpression<bool> *)&_kjCondition);
  }
  if (orphan.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&orphan.builder);
  }
  _kjCondition_4.op.content.size_ = (size_t)(root._builder.pointers + 7);
  _kjCondition_4._0_8_ = root._builder.segment;
  _kjCondition_4.op.content.ptr = (char *)root._builder.capTable;
  PointerBuilder::disown((OrphanBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_4);
  sVar1 = _kjCondition.op.content.size_;
  orphan.builder.capTable = (CapTableBuilder *)_kjCondition.op.content.ptr;
  orphan.builder.location = (word *)_kjCondition.op.content.size_;
  orphan.builder.tag.content = (uint64_t)_kjCondition.left;
  orphan.builder.segment = (SegmentBuilder *)_kjCondition.right;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = sVar1 == 0;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<int,(capnp::Kind)0>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,899,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<int,_(capnp::Kind)0>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  OrphanBuilder::asListReader((ListReader *)&_kjCondition,&orphan.builder,FOUR_BYTES);
  _kjCondition_4._0_8_ = _kjCondition.op.content.size_ << 0x20;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_ = 5;
  _kjCondition_4.result = (uint)_kjCondition.op.content.size_ == 0;
  if ((!_kjCondition_4.result) && (kj::_::Debug::minSeverity < 3)) {
    local_20c = 0;
    OrphanBuilder::asListReader((ListReader *)&_kjCondition,&orphan.builder,FOUR_BYTES);
    local_1ac = (uint)_kjCondition.op.content.size_;
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x385,ERROR,
               "\"failed: expected \" \"(0) == (orphan.getReader().size())\", _kjCondition, 0, orphan.getReader().size()"
               ,(char (*) [52])"failed: expected (0) == (orphan.getReader().size())",&_kjCondition_4
               ,&local_20c,&local_1ac);
  }
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<int,(capnp::Kind)0>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x386,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<int,_(capnp::Kind)0>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  OrphanBuilder::asList((ListBuilder *)&_kjCondition,&orphan.builder,FOUR_BYTES);
  _kjCondition_4._0_8_ = _kjCondition.op.content.size_ << 0x20;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_ = 5;
  _kjCondition_4.result = (uint)_kjCondition.op.content.size_ == 0;
  if ((!_kjCondition_4.result) && (kj::_::Debug::minSeverity < 3)) {
    local_20c = 0;
    OrphanBuilder::asList((ListBuilder *)&_kjCondition,&orphan.builder,FOUR_BYTES);
    local_1ac = (uint)_kjCondition.op.content.size_;
    kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x388,ERROR,
               "\"failed: expected \" \"(0) == (orphan.get().size())\", _kjCondition, 0, orphan.get().size()"
               ,(char (*) [46])"failed: expected (0) == (orphan.get().size())",&_kjCondition_4,
               &local_20c,&local_1ac);
  }
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<int,(capnp::Kind)0>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x389,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<int,_(capnp::Kind)0>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  if (orphan.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&orphan.builder);
  }
  _kjCondition_4.op.content.size_ = (size_t)(root._builder.pointers + 0x11);
  _kjCondition_4._0_8_ = root._builder.segment;
  _kjCondition_4.op.content.ptr = (char *)root._builder.capTable;
  PointerBuilder::disown((OrphanBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_4);
  sVar1 = _kjCondition.op.content.size_;
  orphan.builder.capTable = (CapTableBuilder *)_kjCondition.op.content.ptr;
  orphan.builder.location = (word *)_kjCondition.op.content.size_;
  orphan.builder.tag.content = (uint64_t)_kjCondition.left;
  orphan.builder.segment = (SegmentBuilder *)_kjCondition.right;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = sVar1 == 0;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x38e,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  OrphanBuilder::asListReader((ListReader *)&_kjCondition,&orphan.builder,INLINE_COMPOSITE);
  _kjCondition_4._0_8_ = _kjCondition.op.content.size_ << 0x20;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_ = 5;
  _kjCondition_4.result = (uint)_kjCondition.op.content.size_ == 0;
  if ((!_kjCondition_4.result) && (kj::_::Debug::minSeverity < 3)) {
    local_20c = 0;
    OrphanBuilder::asListReader((ListReader *)&_kjCondition,&orphan.builder,INLINE_COMPOSITE);
    local_1ac = (uint)_kjCondition.op.content.size_;
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x390,ERROR,
               "\"failed: expected \" \"(0) == (orphan.getReader().size())\", _kjCondition, 0, orphan.getReader().size()"
               ,(char (*) [52])"failed: expected (0) == (orphan.getReader().size())",&_kjCondition_4
               ,&local_20c,&local_1ac);
  }
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x391,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  OrphanBuilder::asStructList((ListBuilder *)&_kjCondition,&orphan.builder,(StructSize)0x140006);
  _kjCondition_4._0_8_ = _kjCondition.op.content.size_ << 0x20;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_ = 5;
  _kjCondition_4.result = (uint)_kjCondition.op.content.size_ == 0;
  if ((!_kjCondition_4.result) && (kj::_::Debug::minSeverity < 3)) {
    local_20c = 0;
    OrphanBuilder::asStructList((ListBuilder *)&_kjCondition,&orphan.builder,(StructSize)0x140006);
    local_1ac = (uint)_kjCondition.op.content.size_;
    kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x393,ERROR,
               "\"failed: expected \" \"(0) == (orphan.get().size())\", _kjCondition, 0, orphan.get().size()"
               ,(char (*) [46])"failed: expected (0) == (orphan.get().size())",&_kjCondition_4,
               &local_20c,&local_1ac);
  }
  _kjCondition.result = orphan.builder.location == (word *)0x0;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (Orphan<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x394,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>_&,_std::nullptr_t>
                *)&_kjCondition);
  }
  if (orphan.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&orphan.builder);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, DisownNull) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  {
    Orphan<TestAllTypes> orphan = root.disownStructField();
    EXPECT_TRUE(orphan == nullptr);

    checkTestMessageAllZero(orphan.getReader());
    EXPECT_TRUE(orphan == nullptr);

    // get()ing the orphan allocates an object, for security reasons.
    checkTestMessageAllZero(orphan.get());
    EXPECT_FALSE(orphan == nullptr);
  }

  {
    Orphan<List<int32_t>> orphan = root.disownInt32List();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }

  {
    Orphan<List<TestAllTypes>> orphan = root.disownStructList();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }
}